

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O2

void brotli::StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  
  for (sVar7 = 0; sVar7 != n_commands; sVar7 = sVar7 + 1) {
    uVar3 = commands[sVar7].insert_len_;
    uVar4 = commands[sVar7].copy_len_;
    uVar6 = commands[sVar7].cmd_extra_;
    uVar5 = commands[sVar7].dist_extra_;
    uVar1 = commands[sVar7].cmd_prefix_;
    uVar2 = commands[sVar7].dist_prefix_;
    WriteBits((ulong)cmd_depth[uVar1],(ulong)cmd_bits[uVar1],storage_ix,storage);
    WriteBits(uVar6 >> 0x30,uVar6 & 0xffffffffffff,storage_ix,storage);
    sVar8 = start_pos;
    for (lVar9 = 0; -lVar9 != (ulong)uVar3; lVar9 = lVar9 + -1) {
      WriteBits((ulong)lit_depth[input[sVar8 & mask]],(ulong)lit_bits[input[sVar8 & mask]],
                storage_ix,storage);
      sVar8 = sVar8 + 1;
    }
    if ((ulong)uVar4 != 0 && 0x7f < uVar1) {
      WriteBits((ulong)dist_depth[uVar2],(ulong)dist_bits[uVar2],storage_ix,storage);
      WriteBits((ulong)(uVar5 >> 0x18),(ulong)(uVar5 & 0xffffff),storage_ix,storage);
    }
    start_pos = (start_pos + uVar4) - lVar9;
  }
  return;
}

Assistant:

void StoreDataWithHuffmanCodes(const uint8_t* input,
                               size_t start_pos,
                               size_t mask,
                               const brotli::Command *commands,
                               size_t n_commands,
                               const uint8_t* lit_depth,
                               const uint16_t* lit_bits,
                               const uint8_t* cmd_depth,
                               const uint16_t* cmd_bits,
                               const uint8_t* dist_depth,
                               const uint16_t* dist_bits,
                               size_t* storage_ix,
                               uint8_t* storage) {
  size_t pos = start_pos;
  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    const uint32_t lennumextra = static_cast<uint32_t>(cmd.cmd_extra_ >> 48);
    const uint64_t lenextra = cmd.cmd_extra_ & 0xffffffffffffUL;
    WriteBits(cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    WriteBits(lennumextra, lenextra, storage_ix, storage);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      WriteBits(lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_;
      const uint32_t distnumextra = cmd.dist_extra_ >> 24;
      const uint32_t distextra = cmd.dist_extra_ & 0xffffff;
      WriteBits(dist_depth[dist_code], dist_bits[dist_code],
                storage_ix, storage);
      WriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}